

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O1

double __thiscall chrono::viper::Viper::GetWheelTracTorque(Viper *this,ViperWheelID id)

{
  int iVar1;
  double dVar2;
  
  iVar1 = (*((this->m_driver).
             super___shared_ptr<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ViperDriver[2])();
  if (iVar1 == 1) {
    return 0.0;
  }
  dVar2 = (double)(**(code **)(*(long *)(this->m_drive_motors)._M_elems[id].
                                        super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x280))();
  return dVar2;
}

Assistant:

double Viper::GetWheelTracTorque(ViperWheelID id) const {
    if (m_driver->GetDriveMotorType() == ViperDriver::DriveMotorType::TORQUE)
        return 0;

    return m_drive_motors[id]->GetMotorTorque();
}